

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

bool __thiscall
gguf_reader::read<unsigned_short>
          (gguf_reader *this,vector<unsigned_short,_std::allocator<unsigned_short>_> *dst,size_t n)

{
  size_t sVar1;
  pointer puVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(dst,n);
  puVar2 = (dst->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((dst->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
      super__Vector_impl_data._M_finish == puVar2) {
    bVar5 = true;
  }
  else {
    lVar4 = 0;
    uVar3 = 0;
    do {
      sVar1 = fread((void *)((long)puVar2 + lVar4),1,2,(FILE *)this->file);
      bVar5 = sVar1 == 2;
      if (!bVar5) {
        return bVar5;
      }
      uVar3 = uVar3 + 1;
      puVar2 = (dst->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 2;
    } while (uVar3 < (ulong)((long)(dst->
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 1))
    ;
  }
  return bVar5;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }